

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::SerializeMessageTo<google::protobuf::internal::ArrayOutput>
               (MessageLite *msg,void *table_ptr,ArrayOutput *output)

{
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  uint8 *puVar4;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint8 *base;
  
  if (table_ptr != (void *)0x0) {
    puVar1 = *(uint **)((long)table_ptr + 8);
    uVar3 = *(uint *)((long)&msg->_vptr_MessageLite + (ulong)*puVar1);
    pbVar7 = output->ptr;
    if (uVar3 < 0x80) {
      *pbVar7 = (byte)uVar3;
      pbVar7 = pbVar7 + 1;
    }
    else {
      *pbVar7 = (byte)uVar3 | 0x80;
      if (uVar3 < 0x4000) {
        pbVar7[1] = (byte)(uVar3 >> 7);
        pbVar7 = pbVar7 + 2;
      }
      else {
        pbVar7 = pbVar7 + 2;
        uVar3 = uVar3 >> 7;
        do {
          pbVar6 = pbVar7;
          pbVar6[-1] = (byte)uVar3 | 0x80;
          uVar5 = uVar3 >> 7;
          pbVar7 = pbVar6 + 1;
          bVar2 = 0x3fff < uVar3;
          uVar3 = uVar5;
        } while (bVar2);
        *pbVar6 = (byte)uVar5;
      }
    }
    output->ptr = pbVar7;
    puVar4 = SerializeInternalToArray
                       ((uint8 *)msg,(FieldMetadata *)(puVar1 + 6),*table_ptr + -1,
                        output->is_deterministic,pbVar7);
    output->ptr = puVar4;
    return;
  }
  uVar3 = (*msg->_vptr_MessageLite[10])(msg);
  pbVar7 = output->ptr;
  if (uVar3 < 0x80) {
    *pbVar7 = (byte)uVar3;
    pbVar7 = pbVar7 + 1;
  }
  else {
    *pbVar7 = (byte)uVar3 | 0x80;
    if (uVar3 < 0x4000) {
      pbVar7[1] = (byte)(uVar3 >> 7);
      pbVar7 = pbVar7 + 2;
    }
    else {
      pbVar7 = pbVar7 + 2;
      uVar3 = uVar3 >> 7;
      do {
        pbVar6 = pbVar7;
        pbVar6[-1] = (byte)uVar3 | 0x80;
        uVar5 = uVar3 >> 7;
        pbVar7 = pbVar6 + 1;
        bVar2 = 0x3fff < uVar3;
        uVar3 = uVar5;
      } while (bVar2);
      *pbVar6 = (byte)uVar5;
    }
  }
  output->ptr = pbVar7;
  SerializeMessageNoTable(msg,output);
  return;
}

Assistant:

void SerializeMessageTo(const MessageLite* msg, const void* table_ptr,
                        O* output) {
  const SerializationTable* table =
      static_cast<const SerializationTable*>(table_ptr);
  if (!table) {
    // Proto1
    WriteLengthTo(msg->GetCachedSize(), output);
    SerializeMessageNoTable(msg, output);
    return;
  }
  const FieldMetadata* field_table = table->field_table;
  const uint8* base = reinterpret_cast<const uint8*>(msg);
  int cached_size = *reinterpret_cast<const int32*>(base + field_table->offset);
  WriteLengthTo(cached_size, output);
  int num_fields = table->num_fields - 1;
  SerializeMessageDispatch(*msg, field_table + 1, num_fields, cached_size,
                           output);
}